

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoinVerticesProcess.cpp
# Opt level: O3

int __thiscall
Assimp::JoinVerticesProcess::ProcessMesh(JoinVerticesProcess *this,aiMesh *pMesh,uint meshIndex)

{
  vector<Assimp::Vertex,std::allocator<Assimp::Vertex>> *pvVar1;
  undefined4 *puVar2;
  undefined4 *puVar3;
  pointer pvVar4;
  map<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
  *list;
  _func_int **pp_Var5;
  _func_int *p_Var6;
  _Hash_node_base *p_Var7;
  iterator __position;
  aiAnimMesh *paVar8;
  pointer pVVar9;
  uint *puVar10;
  aiBone *paVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  bool bVar15;
  bool bVar16;
  uint n;
  uint uVar17;
  Base **ppBVar18;
  Logger *pLVar19;
  ostream *poVar20;
  aiVector3D *paVar21;
  aiColor4D *paVar22;
  aiVertexWeight *paVar23;
  long lVar24;
  long lVar25;
  uint a_11;
  ulong uVar26;
  long lVar27;
  pointer puVar28;
  long lVar29;
  __hash_code __code;
  aiFace *paVar30;
  pointer puVar31;
  pointer puVar32;
  undefined1 __src [8];
  ulong uVar33;
  vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> uniqueVertices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> replaceIndex;
  vector<unsigned_int,_std::allocator<unsigned_int>_> verticesFound;
  vector<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
  uniqueAnimatedVertices;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  usedVertexIndices;
  SpatialSort _vertexFinder;
  Vertex v;
  Vertex aniMeshVertex;
  vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> local_3b8;
  pointer local_398;
  uint local_38c;
  ulong local_388;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_380;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_368;
  vector<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
  local_348;
  SpatialSort *local_330;
  long local_328;
  char *local_320;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_318;
  SpatialSort local_2e0;
  undefined1 local_2b8 [8];
  aiVertexWeight *paStack_2b0;
  aiVertexWeight *local_2a8;
  ios_base local_248 [264];
  Vertex local_140;
  
  if (pMesh->mNumVertices == 0 || pMesh->mVertices == (aiVector3D *)0x0) {
    return 0;
  }
  if (pMesh->mFaces == (aiFace *)0x0) {
    return 0;
  }
  if (pMesh->mNumFaces == 0) {
    return 0;
  }
  local_318._M_buckets = &local_318._M_single_bucket;
  local_318._M_bucket_count = 1;
  local_318._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_318._M_element_count = 0;
  local_318._M_rehash_policy._M_max_load_factor = 1.0;
  local_318._M_rehash_policy._M_next_resize = 0;
  local_318._M_single_bucket = (__node_base_ptr)0x0;
  local_38c = meshIndex;
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::rehash(&local_318,(ulong)pMesh->mNumVertices);
  uVar17 = pMesh->mNumFaces;
  if (uVar17 != 0) {
    uVar26 = 0;
    do {
      if (pMesh->mFaces[uVar26].mNumIndices != 0) {
        paVar30 = pMesh->mFaces + uVar26;
        lVar29 = 0;
        uVar33 = 0;
        do {
          local_2b8 = (undefined1  [8])&local_318;
          std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&local_318,(long)paVar30->mIndices + lVar29,local_2b8);
          uVar33 = uVar33 + 1;
          lVar29 = lVar29 + 4;
        } while (uVar33 < paVar30->mNumIndices);
        uVar17 = pMesh->mNumFaces;
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 < uVar17);
  }
  local_3b8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl.
  super__Vector_impl_data._M_finish = (Vertex *)0x0;
  local_3b8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Vertex *)0x0;
  std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::reserve
            (&local_3b8,(ulong)pMesh->mNumVertices);
  local_2b8._0_4_ = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_380,(ulong)pMesh->mNumVertices,(value_type_conflict1 *)local_2b8,
             (allocator_type *)&local_140);
  local_330 = &local_2e0;
  SpatialSort::SpatialSort(local_330);
  list = &((this->super_BaseProcess).shared)->pmap;
  if (list == (map<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
               *)0x0) {
LAB_002faf4c:
    SpatialSort::Fill(&local_2e0,pMesh->mVertices,pMesh->mNumVertices,0xc,true);
  }
  else {
    local_2b8 = (undefined1  [8])0x0;
    ppBVar18 = GetGenericProperty<Assimp::SharedPostProcessInfo::Base*>
                         (list,"$Spat",(Base **)local_2b8);
    if (((*ppBVar18 == (Base *)0x0) ||
        (pp_Var5 = (*ppBVar18)[1]._vptr_Base, pp_Var5 == (_func_int **)0x0)) ||
       (p_Var6 = *pp_Var5, p_Var6 == (_func_int *)0x0)) goto LAB_002faf4c;
    local_330 = (SpatialSort *)(p_Var6 + (ulong)local_38c * 0x30);
  }
  local_368.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_368.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_368.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&local_368,10);
  lVar29 = 6;
  do {
    if (pMesh->mColors[lVar29 + -6] == (aiColor4D *)0x0) {
      bVar16 = true;
      if (lVar29 != 6) goto LAB_002fafc9;
      uVar26 = 0;
      goto LAB_002fafae;
    }
    lVar29 = lVar29 + 1;
  } while (lVar29 != 0xe);
  bVar16 = true;
LAB_002fafc9:
  local_388 = (ulong)pMesh->mNumAnimMeshes;
  local_348.
  super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_348.
  super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_348.
  super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((local_388 != 0) &&
     (std::
      vector<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
      ::resize(&local_348,local_388), pMesh->mNumAnimMeshes != 0)) {
    lVar29 = 0;
    uVar26 = 0;
    do {
      std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::reserve
                ((vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> *)
                 ((long)&((local_348.
                           super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>).
                         _M_impl.super__Vector_impl_data._M_start + lVar29),
                 (ulong)pMesh->mNumVertices);
      uVar26 = uVar26 + 1;
      lVar29 = lVar29 + 0x18;
    } while (uVar26 < pMesh->mNumAnimMeshes);
  }
  uVar17 = pMesh->mNumVertices;
  if (uVar17 != 0) {
    uVar26 = 0;
LAB_002fb050:
    if (local_318._M_buckets[uVar26 % local_318._M_bucket_count] != (__node_base_ptr)0x0) {
      p_Var7 = local_318._M_buckets[uVar26 % local_318._M_bucket_count]->_M_nxt;
      uVar33 = (ulong)*(uint *)&p_Var7[1]._M_nxt;
      do {
        if (uVar26 == uVar33) {
          uVar17 = (uint)uVar26;
          Vertex::Vertex((Vertex *)local_2b8,pMesh,uVar17);
          SpatialSort::FindIdenticalPositions(local_330,(aiVector3D *)local_2b8,&local_368);
          if (local_368.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_368.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start) goto LAB_002fb1fb;
          puVar31 = (pointer)0x0;
          puVar32 = local_368.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          puVar28 = local_368.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          goto LAB_002fb0e8;
        }
        p_Var7 = p_Var7->_M_nxt;
      } while ((p_Var7 != (_Hash_node_base *)0x0) &&
              (uVar33 = (ulong)*(uint *)&p_Var7[1]._M_nxt,
              uVar33 % local_318._M_bucket_count == uVar26 % local_318._M_bucket_count));
    }
    goto LAB_002fb32e;
  }
LAB_002fb348:
  bVar16 = DefaultLogger::isNullLogger();
  if ((!bVar16) && (pLVar19 = DefaultLogger::get(), pLVar19->m_Severity == VERBOSE)) {
    pLVar19 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[6]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
               (char (*) [6])0x6cbc4b);
    std::ostream::_M_insert<unsigned_long>((ulong)local_2b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8," (",2);
    local_320 = "unnamed";
    if ((pMesh->mName).length != 0) {
      local_320 = (pMesh->mName).data;
    }
    poVar20 = (ostream *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        local_2b8,&local_320);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,") | Verts in: ",0xe);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20," out: ",6);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20," | ~",4);
    std::ostream::_M_insert<double>
              ((double)(((float)(((long)local_3b8.
                                        super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_3b8.
                                        super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                 0xf0f0f0f0f0f0f0f + (ulong)pMesh->mNumVertices) /
                        (float)pMesh->mNumVertices) * 100.0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,"%",1);
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar19,(char *)local_140.position._0_8_);
    if ((float *)local_140.position._0_8_ != &local_140.normal.y) {
      operator_delete((void *)local_140.position._0_8_,local_140.normal._4_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b8);
    std::ios_base::~ios_base(local_248);
  }
  uVar17 = (int)((ulong)((long)local_3b8.
                               super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_3b8.
                              super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 4) * -0xf0f0f0f;
  uVar26 = (ulong)uVar17;
  pMesh->mNumVertices = uVar17;
  if (pMesh->mVertices != (aiVector3D *)0x0) {
    operator_delete__(pMesh->mVertices);
    uVar17 = pMesh->mNumVertices;
    uVar26 = (ulong)uVar17 * 0xc;
    paVar21 = (aiVector3D *)operator_new__(uVar26);
    if (uVar17 == 0) {
      pMesh->mVertices = paVar21;
      uVar26 = 0;
    }
    else {
      lVar27 = 0;
      memset(paVar21,0,((uVar26 - 0xc) / 0xc) * 0xc + 0xc);
      pMesh->mVertices = paVar21;
      lVar29 = 0;
      uVar33 = 0;
      do {
        paVar21 = pMesh->mVertices;
        *(undefined4 *)((long)&paVar21->z + lVar29) =
             *(undefined4 *)
              ((long)(local_3b8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                      _M_impl.super__Vector_impl_data._M_start)->texcoords + lVar27 + -0x28);
        *(undefined8 *)((long)&paVar21->x + lVar29) =
             *(undefined8 *)
              ((long)&(((Vertex *)
                       ((local_3b8.
                         super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl
                         .super__Vector_impl_data._M_start)->texcoords + -4))->position).x + lVar27)
        ;
        uVar33 = uVar33 + 1;
        uVar26 = (ulong)pMesh->mNumVertices;
        lVar29 = lVar29 + 0xc;
        lVar27 = lVar27 + 0x110;
      } while (uVar33 < uVar26);
    }
  }
  if (pMesh->mNormals != (aiVector3D *)0x0) {
    operator_delete__(pMesh->mNormals);
    uVar17 = pMesh->mNumVertices;
    uVar26 = (ulong)uVar17 * 0xc;
    paVar21 = (aiVector3D *)operator_new__(uVar26);
    if (uVar17 == 0) {
      pMesh->mNormals = paVar21;
      uVar26 = 0;
    }
    else {
      lVar27 = 0;
      memset(paVar21,0,((uVar26 - 0xc) / 0xc) * 0xc + 0xc);
      pMesh->mNormals = paVar21;
      lVar29 = 0xc;
      uVar33 = 0;
      do {
        paVar21 = pMesh->mNormals;
        *(undefined4 *)((long)&paVar21->z + lVar27) =
             *(undefined4 *)
              ((long)(local_3b8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                      _M_impl.super__Vector_impl_data._M_start)->texcoords + lVar29 + -0x28);
        *(undefined8 *)((long)&paVar21->x + lVar27) =
             *(undefined8 *)
              ((long)&(((Vertex *)
                       ((local_3b8.
                         super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl
                         .super__Vector_impl_data._M_start)->texcoords + -4))->position).x + lVar29)
        ;
        uVar33 = uVar33 + 1;
        uVar26 = (ulong)pMesh->mNumVertices;
        lVar27 = lVar27 + 0xc;
        lVar29 = lVar29 + 0x110;
      } while (uVar33 < uVar26);
    }
  }
  if (pMesh->mTangents != (aiVector3D *)0x0) {
    operator_delete__(pMesh->mTangents);
    uVar17 = pMesh->mNumVertices;
    uVar26 = (ulong)uVar17 * 0xc;
    paVar21 = (aiVector3D *)operator_new__(uVar26);
    if (uVar17 == 0) {
      pMesh->mTangents = paVar21;
      uVar26 = 0;
    }
    else {
      lVar27 = 0;
      memset(paVar21,0,((uVar26 - 0xc) / 0xc) * 0xc + 0xc);
      pMesh->mTangents = paVar21;
      lVar29 = 0x18;
      uVar33 = 0;
      do {
        paVar21 = pMesh->mTangents;
        *(undefined4 *)((long)&paVar21->z + lVar27) =
             *(undefined4 *)
              ((long)(local_3b8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                      _M_impl.super__Vector_impl_data._M_start)->texcoords + lVar29 + -0x28);
        *(undefined8 *)((long)&paVar21->x + lVar27) =
             *(undefined8 *)
              ((long)&(((Vertex *)
                       ((local_3b8.
                         super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl
                         .super__Vector_impl_data._M_start)->texcoords + -4))->position).x + lVar29)
        ;
        uVar33 = uVar33 + 1;
        uVar26 = (ulong)pMesh->mNumVertices;
        lVar27 = lVar27 + 0xc;
        lVar29 = lVar29 + 0x110;
      } while (uVar33 < uVar26);
    }
  }
  if (pMesh->mBitangents != (aiVector3D *)0x0) {
    operator_delete__(pMesh->mBitangents);
    uVar17 = pMesh->mNumVertices;
    uVar26 = (ulong)uVar17 * 0xc;
    paVar21 = (aiVector3D *)operator_new__(uVar26);
    if (uVar17 == 0) {
      pMesh->mBitangents = paVar21;
      uVar26 = 0;
    }
    else {
      lVar27 = 0;
      memset(paVar21,0,((uVar26 - 0xc) / 0xc) * 0xc + 0xc);
      pMesh->mBitangents = paVar21;
      lVar29 = 0x24;
      uVar33 = 0;
      do {
        paVar21 = pMesh->mBitangents;
        *(undefined4 *)((long)&paVar21->z + lVar27) =
             *(undefined4 *)
              ((long)(local_3b8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                      _M_impl.super__Vector_impl_data._M_start)->texcoords + lVar29 + -0x28);
        *(undefined8 *)((long)&paVar21->x + lVar27) =
             *(undefined8 *)
              ((long)&(((Vertex *)
                       ((local_3b8.
                         super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl
                         .super__Vector_impl_data._M_start)->texcoords + -4))->position).x + lVar29)
        ;
        uVar33 = uVar33 + 1;
        uVar26 = (ulong)pMesh->mNumVertices;
        lVar27 = lVar27 + 0xc;
        lVar29 = lVar29 + 0x110;
      } while (uVar33 < uVar26);
    }
  }
  lVar29 = 0x90;
  lVar27 = 0;
  do {
    if ((pMesh->mColors[lVar27] == (aiColor4D *)0x0) || ((int)uVar26 == 0)) break;
    operator_delete__(pMesh->mColors[lVar27]);
    uVar17 = pMesh->mNumVertices;
    uVar26 = (ulong)uVar17 << 4;
    paVar22 = (aiColor4D *)operator_new__(uVar26);
    if (uVar17 == 0) {
      pMesh->mColors[lVar27] = paVar22;
      uVar26 = 0;
    }
    else {
      memset(paVar22,0,uVar26);
      pMesh->mColors[lVar27] = paVar22;
      lVar25 = 0;
      uVar33 = 0;
      lVar24 = lVar29;
      do {
        puVar2 = (undefined4 *)
                 ((long)&(((Vertex *)
                          ((local_3b8.
                            super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                            _M_impl.super__Vector_impl_data._M_start)->texcoords + -4))->position).x
                 + lVar24);
        uVar12 = puVar2[1];
        uVar13 = puVar2[2];
        uVar14 = puVar2[3];
        puVar3 = (undefined4 *)((long)&pMesh->mColors[lVar27]->r + lVar25);
        *puVar3 = *puVar2;
        puVar3[1] = uVar12;
        puVar3[2] = uVar13;
        puVar3[3] = uVar14;
        uVar33 = uVar33 + 1;
        uVar26 = (ulong)pMesh->mNumVertices;
        lVar25 = lVar25 + 0x10;
        lVar24 = lVar24 + 0x110;
      } while (uVar33 < uVar26);
    }
    lVar27 = lVar27 + 1;
    lVar29 = lVar29 + 0x10;
  } while (lVar27 != 8);
  lVar29 = 0x30;
  lVar27 = 0;
  do {
    if ((pMesh->mTextureCoords[lVar27] == (aiVector3D *)0x0) || ((int)uVar26 == 0)) break;
    operator_delete__(pMesh->mTextureCoords[lVar27]);
    uVar17 = pMesh->mNumVertices;
    uVar26 = (ulong)uVar17 * 0xc;
    paVar21 = (aiVector3D *)operator_new__(uVar26);
    if (uVar17 == 0) {
      pMesh->mTextureCoords[lVar27] = paVar21;
      uVar26 = 0;
    }
    else {
      memset(paVar21,0,((uVar26 - 0xc) / 0xc) * 0xc + 0xc);
      pMesh->mTextureCoords[lVar27] = paVar21;
      lVar25 = 0;
      uVar33 = 0;
      lVar24 = lVar29;
      do {
        paVar21 = pMesh->mTextureCoords[lVar27];
        *(undefined4 *)((long)&paVar21->z + lVar25) =
             *(undefined4 *)
              ((long)(local_3b8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                      _M_impl.super__Vector_impl_data._M_start)->texcoords + lVar24 + -0x28);
        *(undefined8 *)((long)&paVar21->x + lVar25) =
             *(undefined8 *)
              ((long)&(((Vertex *)
                       ((local_3b8.
                         super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl
                         .super__Vector_impl_data._M_start)->texcoords + -4))->position).x + lVar24)
        ;
        uVar33 = uVar33 + 1;
        uVar26 = (ulong)pMesh->mNumVertices;
        lVar25 = lVar25 + 0xc;
        lVar24 = lVar24 + 0x110;
      } while (uVar33 < uVar26);
    }
    lVar27 = lVar27 + 1;
    lVar29 = lVar29 + 0xc;
  } while (lVar27 != 8);
  if ((local_388 != 0) && (pMesh->mNumAnimMeshes != 0)) {
    puVar32 = (pointer)0x0;
    do {
      paVar8 = pMesh->mAnimMeshes[(long)puVar32];
      pvVar4 = local_348.
               super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + (long)puVar32;
      paVar8->mNumVertices =
           (int)((ulong)((long)(pvVar4->
                               super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pvVar4->
                              super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>).
                              _M_impl.super__Vector_impl_data._M_start) >> 4) * -0xf0f0f0f;
      if (paVar8->mVertices != (aiVector3D *)0x0) {
        operator_delete__(paVar8->mVertices);
        uVar17 = paVar8->mNumVertices;
        uVar26 = (ulong)uVar17 * 0xc;
        paVar21 = (aiVector3D *)operator_new__(uVar26);
        if (uVar17 == 0) {
          paVar8->mVertices = paVar21;
        }
        else {
          memset(paVar21,0,((uVar26 - 0xc) / 0xc) * 0xc + 0xc);
          paVar8->mVertices = paVar21;
          lVar29 = 0;
          lVar27 = 0;
          uVar26 = 0;
          do {
            pVVar9 = (pvVar4->super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            paVar21 = paVar8->mVertices;
            *(undefined4 *)((long)&paVar21->z + lVar27) =
                 *(undefined4 *)((long)pVVar9->texcoords + lVar29 + -0x28);
            *(undefined8 *)((long)&paVar21->x + lVar27) =
                 *(undefined8 *)((long)&(((Vertex *)(pVVar9->texcoords + -4))->position).x + lVar29)
            ;
            uVar26 = uVar26 + 1;
            lVar27 = lVar27 + 0xc;
            lVar29 = lVar29 + 0x110;
          } while (uVar26 < paVar8->mNumVertices);
        }
      }
      if (paVar8->mNormals != (aiVector3D *)0x0) {
        operator_delete__(paVar8->mNormals);
        uVar17 = paVar8->mNumVertices;
        uVar26 = (ulong)uVar17 * 0xc;
        paVar21 = (aiVector3D *)operator_new__(uVar26);
        if (uVar17 == 0) {
          paVar8->mNormals = paVar21;
        }
        else {
          memset(paVar21,0,((uVar26 - 0xc) / 0xc) * 0xc + 0xc);
          paVar8->mNormals = paVar21;
          lVar29 = 0xc;
          lVar27 = 0;
          uVar26 = 0;
          do {
            pVVar9 = (pvVar4->super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            paVar21 = paVar8->mNormals;
            *(undefined4 *)((long)&paVar21->z + lVar27) =
                 *(undefined4 *)((long)pVVar9->texcoords + lVar29 + -0x28);
            *(undefined8 *)((long)&paVar21->x + lVar27) =
                 *(undefined8 *)((long)&(((Vertex *)(pVVar9->texcoords + -4))->position).x + lVar29)
            ;
            uVar26 = uVar26 + 1;
            lVar27 = lVar27 + 0xc;
            lVar29 = lVar29 + 0x110;
          } while (uVar26 < paVar8->mNumVertices);
        }
      }
      if (paVar8->mTangents != (aiVector3D *)0x0) {
        operator_delete__(paVar8->mTangents);
        uVar17 = paVar8->mNumVertices;
        uVar26 = (ulong)uVar17 * 0xc;
        paVar21 = (aiVector3D *)operator_new__(uVar26);
        if (uVar17 == 0) {
          paVar8->mTangents = paVar21;
        }
        else {
          memset(paVar21,0,((uVar26 - 0xc) / 0xc) * 0xc + 0xc);
          paVar8->mTangents = paVar21;
          lVar29 = 0x18;
          lVar27 = 0;
          uVar26 = 0;
          do {
            pVVar9 = (pvVar4->super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            paVar21 = paVar8->mTangents;
            *(undefined4 *)((long)&paVar21->z + lVar27) =
                 *(undefined4 *)((long)pVVar9->texcoords + lVar29 + -0x28);
            *(undefined8 *)((long)&paVar21->x + lVar27) =
                 *(undefined8 *)((long)&(((Vertex *)(pVVar9->texcoords + -4))->position).x + lVar29)
            ;
            uVar26 = uVar26 + 1;
            lVar27 = lVar27 + 0xc;
            lVar29 = lVar29 + 0x110;
          } while (uVar26 < paVar8->mNumVertices);
        }
      }
      if (paVar8->mBitangents != (aiVector3D *)0x0) {
        operator_delete__(paVar8->mBitangents);
        uVar17 = paVar8->mNumVertices;
        uVar26 = (ulong)uVar17 * 0xc;
        paVar21 = (aiVector3D *)operator_new__(uVar26);
        if (uVar17 == 0) {
          paVar8->mBitangents = paVar21;
        }
        else {
          memset(paVar21,0,((uVar26 - 0xc) / 0xc) * 0xc + 0xc);
          paVar8->mBitangents = paVar21;
          lVar29 = 0x24;
          lVar27 = 0;
          uVar26 = 0;
          do {
            pVVar9 = (pvVar4->super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            paVar21 = paVar8->mBitangents;
            *(undefined4 *)((long)&paVar21->z + lVar27) =
                 *(undefined4 *)((long)pVVar9->texcoords + lVar29 + -0x28);
            *(undefined8 *)((long)&paVar21->x + lVar27) =
                 *(undefined8 *)((long)&(((Vertex *)(pVVar9->texcoords + -4))->position).x + lVar29)
            ;
            uVar26 = uVar26 + 1;
            lVar27 = lVar27 + 0xc;
            lVar29 = lVar29 + 0x110;
          } while (uVar26 < paVar8->mNumVertices);
        }
      }
      lVar29 = 0x90;
      lVar27 = 0;
      local_398 = puVar32;
      do {
        if (paVar8->mColors[lVar27] == (aiColor4D *)0x0) break;
        operator_delete__(paVar8->mColors[lVar27]);
        uVar17 = paVar8->mNumVertices;
        uVar26 = (ulong)uVar17 << 4;
        paVar22 = (aiColor4D *)operator_new__(uVar26);
        if (uVar17 != 0) {
          memset(paVar22,0,uVar26);
        }
        paVar8->mColors[lVar27] = paVar22;
        if (paVar8->mNumVertices != 0) {
          lVar25 = 0;
          uVar26 = 0;
          lVar24 = lVar29;
          do {
            puVar2 = (undefined4 *)
                     ((long)&(((Vertex *)
                              (((pvVar4->
                                super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>)
                                ._M_impl.super__Vector_impl_data._M_start)->texcoords + -4))->
                             position).x + lVar24);
            uVar12 = puVar2[1];
            uVar13 = puVar2[2];
            uVar14 = puVar2[3];
            puVar3 = (undefined4 *)((long)&paVar8->mColors[lVar27]->r + lVar25);
            *puVar3 = *puVar2;
            puVar3[1] = uVar12;
            puVar3[2] = uVar13;
            puVar3[3] = uVar14;
            uVar26 = uVar26 + 1;
            lVar25 = lVar25 + 0x10;
            lVar24 = lVar24 + 0x110;
          } while (uVar26 < paVar8->mNumVertices);
        }
        lVar27 = lVar27 + 1;
        lVar29 = lVar29 + 0x10;
      } while (lVar27 != 8);
      lVar27 = 0x30;
      lVar29 = 0;
      do {
        if (paVar8->mTextureCoords[lVar29] == (aiVector3D *)0x0) break;
        operator_delete__(paVar8->mTextureCoords[lVar29]);
        uVar17 = paVar8->mNumVertices;
        uVar26 = (ulong)uVar17 * 0xc;
        paVar21 = (aiVector3D *)operator_new__(uVar26);
        if (uVar17 != 0) {
          memset(paVar21,0,((uVar26 - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar8->mTextureCoords[lVar29] = paVar21;
        if (paVar8->mNumVertices != 0) {
          lVar25 = 0;
          uVar26 = 0;
          lVar24 = lVar27;
          do {
            pVVar9 = (pvVar4->super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            paVar21 = paVar8->mTextureCoords[lVar29];
            *(undefined4 *)((long)&paVar21->z + lVar25) =
                 *(undefined4 *)((long)pVVar9->texcoords + lVar24 + -0x28);
            *(undefined8 *)((long)&paVar21->x + lVar25) =
                 *(undefined8 *)((long)&(((Vertex *)(pVVar9->texcoords + -4))->position).x + lVar24)
            ;
            uVar26 = uVar26 + 1;
            lVar25 = lVar25 + 0xc;
            lVar24 = lVar24 + 0x110;
          } while (uVar26 < paVar8->mNumVertices);
        }
        lVar29 = lVar29 + 1;
        lVar27 = lVar27 + 0xc;
      } while (lVar29 != 8);
      puVar32 = (pointer)((long)local_398 + 1);
    } while (puVar32 < (pointer)(ulong)pMesh->mNumAnimMeshes);
  }
  uVar17 = pMesh->mNumFaces;
  if (uVar17 != 0) {
    uVar26 = 0;
    do {
      if (pMesh->mFaces[uVar26].mNumIndices != 0) {
        paVar30 = pMesh->mFaces + uVar26;
        uVar33 = 0;
        do {
          puVar10 = paVar30->mIndices;
          puVar10[uVar33] =
               local_380.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[puVar10[uVar33]] & 0x7fffffff;
          uVar33 = uVar33 + 1;
        } while (uVar33 < paVar30->mNumIndices);
        uVar17 = pMesh->mNumFaces;
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 < uVar17);
  }
  if (0 < (int)pMesh->mNumBones) {
    lVar29 = 0;
    do {
      paVar11 = pMesh->mBones[lVar29];
      local_2b8 = (undefined1  [8])0x0;
      paStack_2b0 = (aiVertexWeight *)0x0;
      local_2a8 = (aiVertexWeight *)0x0;
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::reserve
                ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)local_2b8,
                 (ulong)paVar11->mNumWeights);
      if (paVar11->mWeights == (aiVertexWeight *)0x0) {
        pLVar19 = DefaultLogger::get();
        Logger::error(pLVar19,"X-Export: aiBone shall contain weights, but pointer to them is NULL."
                     );
      }
      else {
        uVar17 = paVar11->mNumWeights;
        if (uVar17 != 0) {
          uVar26 = 0;
          do {
            paVar23 = paVar11->mWeights;
            if (-1 < (int)local_380.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start[paVar23[uVar26].mVertexId]) {
              local_140.position.y = paVar23[uVar26].mWeight;
              local_140.position.x =
                   (float)local_380.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start[paVar23[uVar26].mVertexId];
              if (paStack_2b0 == local_2a8) {
                std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>::
                _M_realloc_insert<aiVertexWeight_const&>
                          ((vector<aiVertexWeight,std::allocator<aiVertexWeight>> *)local_2b8,
                           (iterator)paStack_2b0,(aiVertexWeight *)&local_140);
              }
              else {
                paStack_2b0->mVertexId =
                     local_380.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[paVar23[uVar26].mVertexId];
                paStack_2b0->mWeight = local_140.position.y;
                paStack_2b0 = paStack_2b0 + 1;
              }
              uVar17 = paVar11->mNumWeights;
            }
            uVar26 = uVar26 + 1;
          } while (uVar26 < uVar17);
        }
      }
      __src = local_2b8;
      if ((undefined1  [8])paStack_2b0 != local_2b8) {
        if (paVar11->mWeights != (aiVertexWeight *)0x0) {
          operator_delete__(paVar11->mWeights);
        }
        __src = local_2b8;
        uVar33 = (long)paStack_2b0 - (long)local_2b8 >> 3;
        paVar11->mNumWeights = (uint)uVar33;
        uVar33 = uVar33 & 0xffffffff;
        uVar26 = uVar33 * 8;
        paVar23 = (aiVertexWeight *)operator_new__(uVar26);
        if (uVar33 != 0) {
          memset(paVar23,0,uVar26);
        }
        paVar11->mWeights = paVar23;
        memcpy(paVar23,(void *)__src,(ulong)paVar11->mNumWeights << 3);
      }
      if (__src != (undefined1  [8])0x0) {
        operator_delete((void *)__src,(long)local_2a8 - (long)__src);
      }
      lVar29 = lVar29 + 1;
    } while (lVar29 < (int)pMesh->mNumBones);
  }
  uVar17 = pMesh->mNumVertices;
  std::
  vector<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
  ::~vector(&local_348);
  if (local_368.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_368.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_368.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_368.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  SpatialSort::~SpatialSort(&local_2e0);
  if (local_380.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_380.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_380.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_380.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3b8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3b8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3b8.
                          super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3b8.
                          super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_318);
  return uVar17;
  while (uVar26 = uVar26 + 1, uVar26 != 8) {
LAB_002fafae:
    if (pMesh->mTextureCoords[uVar26] == (aiVector3D *)0x0) {
      bVar16 = 1 < uVar26;
      break;
    }
  }
  goto LAB_002fafc9;
LAB_002fb0e8:
  do {
    lVar29 = (long)(int)local_380.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[puVar28[(long)puVar31]];
    if (-1 < lVar29) {
      local_398 = local_380.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_328 = lVar29;
      bVar15 = anon_unknown.dwarf_d0b24::areVerticesEqual
                         ((Vertex *)local_2b8,
                          local_3b8.
                          super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar29,bVar16);
      if (bVar15) {
        puVar32 = local_398;
        if ((local_388 == 0) ||
           (puVar32 = local_380.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start, pMesh->mNumAnimMeshes == 0)) {
LAB_002fb25b:
          puVar32[uVar26] = (uint)local_328 | 0x80000000;
          goto LAB_002fb323;
        }
        lVar27 = 0;
        uVar33 = 0;
        local_398 = puVar31;
        while( true ) {
          lVar24 = *(long *)((long)&((local_348.
                                      super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>
                                    )._M_impl.super__Vector_impl_data._M_start + lVar27);
          Vertex::Vertex(&local_140,pMesh->mAnimMeshes[uVar33],uVar17);
          bVar15 = anon_unknown.dwarf_d0b24::areVerticesEqual
                             (&local_140,(Vertex *)(lVar24 + lVar29 * 0x110),bVar16);
          puVar32 = local_368.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          puVar28 = local_368.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          puVar31 = local_398;
          if (!bVar15) break;
          uVar33 = uVar33 + 1;
          lVar27 = lVar27 + 0x18;
          puVar32 = local_380.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (pMesh->mNumAnimMeshes <= uVar33) goto LAB_002fb25b;
        }
      }
    }
    puVar31 = (pointer)(ulong)((int)puVar31 + 1);
  } while (puVar31 < (pointer)((long)puVar32 - (long)puVar28 >> 2));
LAB_002fb1fb:
  pVVar9 = local_3b8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_380.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[uVar26] =
       (int)((ulong)((long)local_3b8.
                           super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_3b8.
                          super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 4) * -0xf0f0f0f;
  if (local_3b8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_3b8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::Vertex,std::allocator<Assimp::Vertex>>::
    _M_realloc_insert<Assimp::Vertex_const&>
              ((vector<Assimp::Vertex,std::allocator<Assimp::Vertex>> *)&local_3b8,
               (iterator)
               local_3b8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl
               .super__Vector_impl_data._M_finish,(Vertex *)local_2b8);
  }
  else {
    memcpy(local_3b8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl.
           super__Vector_impl_data._M_finish,local_2b8,0x110);
    local_3b8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar9 + 1;
  }
  if ((local_388 != 0) && (pMesh->mNumAnimMeshes != 0)) {
    lVar29 = 0;
    uVar33 = 0;
    do {
      Vertex::Vertex(&local_140,pMesh->mAnimMeshes[uVar33],uVar17);
      pvVar1 = (vector<Assimp::Vertex,std::allocator<Assimp::Vertex>> *)
               ((long)&((local_348.
                         super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar29);
      __position._M_current =
           *(Vertex **)
            ((long)&((local_348.
                      super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>)._M_impl.
                    super__Vector_impl_data._M_finish + lVar29);
      if (__position._M_current ==
          *(Vertex **)
           ((long)&((local_348.
                     super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>)._M_impl.
                   super__Vector_impl_data._M_end_of_storage + lVar29)) {
        std::vector<Assimp::Vertex,std::allocator<Assimp::Vertex>>::
        _M_realloc_insert<Assimp::Vertex_const&>(pvVar1,__position,&local_140);
      }
      else {
        memcpy(__position._M_current,&local_140,0x110);
        pvVar1 = pvVar1 + 8;
        *(long *)pvVar1 = *(long *)pvVar1 + 0x110;
      }
      uVar33 = uVar33 + 1;
      lVar29 = lVar29 + 0x18;
    } while (uVar33 < pMesh->mNumAnimMeshes);
  }
LAB_002fb323:
  uVar17 = pMesh->mNumVertices;
LAB_002fb32e:
  uVar26 = uVar26 + 1;
  if (uVar17 <= uVar26) goto LAB_002fb348;
  goto LAB_002fb050;
}

Assistant:

int JoinVerticesProcess::ProcessMesh( aiMesh* pMesh, unsigned int meshIndex)
{
    static_assert( AI_MAX_NUMBER_OF_COLOR_SETS    == 8, "AI_MAX_NUMBER_OF_COLOR_SETS    == 8");
	static_assert( AI_MAX_NUMBER_OF_TEXTURECOORDS == 8, "AI_MAX_NUMBER_OF_TEXTURECOORDS == 8");

    // Return early if we don't have any positions
    if (!pMesh->HasPositions() || !pMesh->HasFaces()) {
        return 0;
    }

    // We should care only about used vertices, not all of them
    // (this can happen due to original file vertices buffer being used by
    // multiple meshes)
    std::unordered_set<unsigned int> usedVertexIndices;
    usedVertexIndices.reserve(pMesh->mNumVertices);
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++)
    {
        aiFace& face = pMesh->mFaces[a];
        for( unsigned int b = 0; b < face.mNumIndices; b++) {
            usedVertexIndices.insert(face.mIndices[b]);
        }
    }

    // We'll never have more vertices afterwards.
    std::vector<Vertex> uniqueVertices;
    uniqueVertices.reserve( pMesh->mNumVertices);

    // For each vertex the index of the vertex it was replaced by.
    // Since the maximal number of vertices is 2^31-1, the most significand bit can be used to mark
    //  whether a new vertex was created for the index (true) or if it was replaced by an existing
    //  unique vertex (false). This saves an additional std::vector<bool> and greatly enhances
    //  branching performance.
    static_assert(AI_MAX_VERTICES == 0x7fffffff, "AI_MAX_VERTICES == 0x7fffffff");
    std::vector<unsigned int> replaceIndex( pMesh->mNumVertices, 0xffffffff);

    // float posEpsilonSqr;
    SpatialSort* vertexFinder = NULL;
    SpatialSort _vertexFinder;

    typedef std::pair<SpatialSort,float> SpatPair;
    if (shared) {
        std::vector<SpatPair >* avf;
        shared->GetProperty(AI_SPP_SPATIAL_SORT,avf);
        if (avf)    {
            SpatPair& blubb = (*avf)[meshIndex];
            vertexFinder  = &blubb.first;
            // posEpsilonSqr = blubb.second;
        }
    }
    if (!vertexFinder)  {
        // bad, need to compute it.
        _vertexFinder.Fill(pMesh->mVertices, pMesh->mNumVertices, sizeof( aiVector3D));
        vertexFinder = &_vertexFinder;
        // posEpsilonSqr = ComputePositionEpsilon(pMesh);
    }

    // Again, better waste some bytes than a realloc ...
    std::vector<unsigned int> verticesFound;
    verticesFound.reserve(10);

    // Run an optimized code path if we don't have multiple UVs or vertex colors.
    // This should yield false in more than 99% of all imports ...
    const bool complex = ( pMesh->GetNumColorChannels() > 0 || pMesh->GetNumUVChannels() > 1);
    const bool hasAnimMeshes = pMesh->mNumAnimMeshes > 0;

    // We'll never have more vertices afterwards.
    std::vector<std::vector<Vertex>> uniqueAnimatedVertices;
    if (hasAnimMeshes) {
        uniqueAnimatedVertices.resize(pMesh->mNumAnimMeshes);
        for (unsigned int animMeshIndex = 0; animMeshIndex < pMesh->mNumAnimMeshes; animMeshIndex++) {
            uniqueAnimatedVertices[animMeshIndex].reserve(pMesh->mNumVertices);
        }
    }

    // Now check each vertex if it brings something new to the table
    for( unsigned int a = 0; a < pMesh->mNumVertices; a++)  {
        if (usedVertexIndices.find(a) == usedVertexIndices.end()) {
            continue;
        }

        // collect the vertex data
        Vertex v(pMesh,a);

        // collect all vertices that are close enough to the given position
        vertexFinder->FindIdenticalPositions( v.position, verticesFound);
        unsigned int matchIndex = 0xffffffff;

        // check all unique vertices close to the position if this vertex is already present among them
        for( unsigned int b = 0; b < verticesFound.size(); b++) {
            const unsigned int vidx = verticesFound[b];
            const unsigned int uidx = replaceIndex[ vidx];
            if( uidx & 0x80000000)
                continue;

            const Vertex& uv = uniqueVertices[ uidx];

            if (!areVerticesEqual(v, uv, complex)) {
                continue;
            }

            if (hasAnimMeshes) {
                // If given vertex is animated, then it has to be preserver 1 to 1 (base mesh and animated mesh require same topology)
                // NOTE: not doing this totaly breaks anim meshes as they don't have their own faces (they use pMesh->mFaces)
                bool breaksAnimMesh = false;
                for (unsigned int animMeshIndex = 0; animMeshIndex < pMesh->mNumAnimMeshes; animMeshIndex++) {
                    const Vertex& animatedUV = uniqueAnimatedVertices[animMeshIndex][ uidx];
                    Vertex aniMeshVertex(pMesh->mAnimMeshes[animMeshIndex], a);
                    if (!areVerticesEqual(aniMeshVertex, animatedUV, complex)) {
                        breaksAnimMesh = true;
                        break;
                    }
                }
                if (breaksAnimMesh) {
                    continue;
                }
            }

            // we're still here -> this vertex perfectly matches our given vertex
            matchIndex = uidx;
            break;
        }

        // found a replacement vertex among the uniques?
        if( matchIndex != 0xffffffff)
        {
            // store where to found the matching unique vertex
            replaceIndex[a] = matchIndex | 0x80000000;
        }
        else
        {
            // no unique vertex matches it up to now -> so add it
            replaceIndex[a] = (unsigned int)uniqueVertices.size();
            uniqueVertices.push_back( v);
            if (hasAnimMeshes) {
                for (unsigned int animMeshIndex = 0; animMeshIndex < pMesh->mNumAnimMeshes; animMeshIndex++) {
                    Vertex aniMeshVertex(pMesh->mAnimMeshes[animMeshIndex], a);
                    uniqueAnimatedVertices[animMeshIndex].push_back(aniMeshVertex);
                }
            }
        }
    }

    if (!DefaultLogger::isNullLogger() && DefaultLogger::get()->getLogSeverity() == Logger::VERBOSE)    {
        ASSIMP_LOG_DEBUG_F(
            "Mesh ",meshIndex,
            " (",
            (pMesh->mName.length ? pMesh->mName.data : "unnamed"),
            ") | Verts in: ",pMesh->mNumVertices,
            " out: ",
            uniqueVertices.size(),
            " | ~",
            ((pMesh->mNumVertices - uniqueVertices.size()) / (float)pMesh->mNumVertices) * 100.f,
            "%"
        );
    }

    updateXMeshVertices(pMesh, uniqueVertices);
    if (hasAnimMeshes) {
        for (unsigned int animMeshIndex = 0; animMeshIndex < pMesh->mNumAnimMeshes; animMeshIndex++) {
            updateXMeshVertices(pMesh->mAnimMeshes[animMeshIndex], uniqueAnimatedVertices[animMeshIndex]);
        }
    }

    // adjust the indices in all faces
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++)
    {
        aiFace& face = pMesh->mFaces[a];
        for( unsigned int b = 0; b < face.mNumIndices; b++) {
            face.mIndices[b] = replaceIndex[face.mIndices[b]] & ~0x80000000;
        }
    }

    // adjust bone vertex weights.
    for( int a = 0; a < (int)pMesh->mNumBones; a++) {
        aiBone* bone = pMesh->mBones[a];
        std::vector<aiVertexWeight> newWeights;
        newWeights.reserve( bone->mNumWeights);

        if ( NULL != bone->mWeights ) {
            for ( unsigned int b = 0; b < bone->mNumWeights; b++ ) {
                const aiVertexWeight& ow = bone->mWeights[ b ];
                // if the vertex is a unique one, translate it
                if ( !( replaceIndex[ ow.mVertexId ] & 0x80000000 ) ) {
                    aiVertexWeight nw;
                    nw.mVertexId = replaceIndex[ ow.mVertexId ];
                    nw.mWeight = ow.mWeight;
                    newWeights.push_back( nw );
                }
            }
        } else {
            ASSIMP_LOG_ERROR( "X-Export: aiBone shall contain weights, but pointer to them is NULL." );
        }

        if (newWeights.size() > 0) {
            // kill the old and replace them with the translated weights
            delete [] bone->mWeights;
            bone->mNumWeights = (unsigned int)newWeights.size();

            bone->mWeights = new aiVertexWeight[bone->mNumWeights];
            memcpy( bone->mWeights, &newWeights[0], bone->mNumWeights * sizeof( aiVertexWeight));
        }
    }
    return pMesh->mNumVertices;
}